

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_fxsub(sexp ctx,sexp a,sexp_uint_t b)

{
  ulong uVar1;
  sexp_uint_t sVar2;
  sexp_uint_t *psVar3;
  ulong in_RDX;
  sexp in_RSI;
  sexp_uint_t n;
  sexp_uint_t i;
  sexp_uint_t borrow;
  sexp_uint_t *data;
  sexp_uint_t len;
  long local_38;
  ulong local_30;
  
  sVar2 = sexp_bignum_hi(in_RSI);
  psVar3 = &(in_RSI->value).string.length;
  local_38 = 0;
  local_30 = in_RDX;
  if ((sVar2 == 1) && (*psVar3 < in_RDX)) {
    *psVar3 = in_RDX - *psVar3;
    (in_RSI->value).flonum_bits[0] = -(in_RSI->value).flonum_bits[0];
  }
  else {
    for (; local_30 != 0; local_30 = (ulong)(int)(uint)(uVar1 < local_30)) {
      uVar1 = psVar3[local_38];
      psVar3[local_38] = psVar3[local_38] - local_30;
      local_38 = local_38 + 1;
    }
  }
  return in_RSI;
}

Assistant:

sexp sexp_bignum_fxsub (sexp ctx, sexp a, sexp_uint_t b) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a), borrow, i=0, n;
  if ((len == 1) && (b > data[0])) {
    data[0] = b - data[0];
    sexp_bignum_sign(a) = -sexp_bignum_sign(a);
  } else {
    for (borrow=b; borrow; i++) {
      n = data[i];
      data[i] -= borrow;
      borrow = (n < borrow);
    }
  }
  return a;
}